

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder__postinit(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_data_converter *pConverter;
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  _func_void_ptr_size_t_void_ptr *p_Var5;
  ulong uVar6;
  ma_result mVar7;
  void *pvVar8;
  ma_uint32 internalChannels;
  ma_format internalFormat;
  ma_uint32 internalSampleRate;
  ma_uint64 unused;
  ma_data_converter_config local_1a0;
  ma_channel internalChannelMap [254];
  
  mVar7 = ma_data_source_get_data_format
                    (pDecoder->pBackend,&internalFormat,&internalChannels,&internalSampleRate,
                     internalChannelMap,0xfe);
  if (mVar7 == MA_SUCCESS) {
    uVar3 = pConfig->channels;
    if (internalChannels < 0xff && uVar3 < 0xff) {
      local_1a0.formatOut = pConfig->format;
      if (pConfig->format == ma_format_unknown) {
        local_1a0.formatOut = internalFormat;
      }
      pDecoder->outputFormat = local_1a0.formatOut;
      local_1a0.channelsOut = uVar3;
      if (uVar3 == 0) {
        local_1a0.channelsOut = internalChannels;
      }
      pDecoder->outputChannels = local_1a0.channelsOut;
      local_1a0.sampleRateOut = pConfig->sampleRate;
      if (pConfig->sampleRate == 0) {
        local_1a0.sampleRateOut = internalSampleRate;
      }
      pDecoder->outputSampleRate = local_1a0.sampleRateOut;
      local_1a0.calculateLFEFromSpatialChannels = 0;
      local_1a0._52_4_ = 0;
      local_1a0.ppChannelWeights = (float **)0x0;
      local_1a0._68_4_ = 0;
      local_1a0.formatIn = internalFormat;
      local_1a0.channelsIn = internalChannels;
      local_1a0.sampleRateIn = internalSampleRate;
      local_1a0.pChannelMapOut = pConfig->pChannelMap;
      uVar1 = pConfig->channelMixMode;
      uVar2 = pConfig->ditherMode;
      local_1a0.channelMixMode = uVar1;
      local_1a0.ditherMode = uVar2;
      local_1a0.allowDynamicSampleRate = 0;
      local_1a0.resampling.format = (pConfig->resampling).format;
      local_1a0.resampling.channels = (pConfig->resampling).channels;
      local_1a0.resampling.sampleRateIn = (pConfig->resampling).sampleRateIn;
      local_1a0.resampling.sampleRateOut = (pConfig->resampling).sampleRateOut;
      local_1a0.resampling.algorithm = (pConfig->resampling).algorithm;
      local_1a0.resampling._20_4_ = *(undefined4 *)&(pConfig->resampling).field_0x14;
      local_1a0.resampling.pBackendVTable = (pConfig->resampling).pBackendVTable;
      local_1a0.resampling.pBackendUserData = (pConfig->resampling).pBackendUserData;
      local_1a0.resampling.linear.lpfOrder = (pConfig->resampling).linear.lpfOrder;
      local_1a0.resampling._44_4_ = *(undefined4 *)&(pConfig->resampling).field_0x2c;
      pConverter = &pDecoder->converter;
      local_1a0.pChannelMapIn = internalChannelMap;
      mVar7 = ma_data_converter_init(&local_1a0,&pDecoder->allocationCallbacks,pConverter);
      if (mVar7 == MA_SUCCESS) {
        mVar7 = ma_data_converter_get_required_input_frame_count(pConverter,1,&unused);
        if (mVar7 == MA_SUCCESS) {
          return MA_SUCCESS;
        }
        iVar4 = *(int *)(&DAT_001908a0 + (ulong)internalFormat * 4);
        uVar6 = 0x1000 / (ulong)(iVar4 * internalChannels);
        pDecoder->inputCacheCap = uVar6;
        p_Var5 = (pDecoder->allocationCallbacks).onMalloc;
        if (p_Var5 == (_func_void_ptr_size_t_void_ptr *)0x0) {
          pDecoder->pInputCache = (void *)0x0;
        }
        else {
          pvVar8 = (*p_Var5)(uVar6 * (iVar4 * internalChannels),
                             (pDecoder->allocationCallbacks).pUserData);
          pDecoder->pInputCache = pvVar8;
          if (pvVar8 != (void *)0x0) {
            return MA_SUCCESS;
          }
        }
        ma_data_converter_uninit(pConverter,&pDecoder->allocationCallbacks);
        mVar7 = MA_OUT_OF_MEMORY;
      }
    }
    else {
      mVar7 = MA_INVALID_ARGS;
    }
  }
  ma_decoder_uninit(pDecoder);
  return mVar7;
}

Assistant:

static ma_result ma_decoder__postinit(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;

    result = ma_decoder__init_data_converter(pDecoder, pConfig);

    /* If we failed post initialization we need to uninitialize the decoder before returning to prevent a memory leak. */
    if (result != MA_SUCCESS) {
        ma_decoder_uninit(pDecoder);
        return result;
    }

    return result;
}